

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

bool glcts::PipelineStatisticsQueryTestFunctional2::executeClearDepthBufferTest(void *pThis)

{
  deUint32 err;
  long lVar1;
  
  lVar1 = (**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x18))();
  (**(code **)(lVar1 + 0x188))(0x100);
  err = (**(code **)(lVar1 + 0x800))();
  glu::checkError(err,"glClear() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0xa7a);
  return true;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeClearDepthBufferTest(void* pThis)
{
	PipelineStatisticsQueryTestFunctional2* data_ptr = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl		 = data_ptr->m_context.getRenderContext().getFunctions();

	gl.clear(GL_DEPTH_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

	return true;
}